

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixFileControl(sqlite3_file *id,int op,void *pArg)

{
  long lVar1;
  sqlite3_io_methods *psVar2;
  uchar mask;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  sqlite3_io_methods *psVar6;
  int *piVar7;
  int iVar8;
  long offset;
  long lVar9;
  long lVar10;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_98;
  int local_90;
  
  iVar3 = 0xc;
  switch(op) {
  case 1:
    uVar4 = (uint)*(byte *)((long)&id[3].pMethods + 4);
    goto LAB_0012442f;
  case 2:
  case 3:
  case 7:
  case 8:
  case 9:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x13:
    break;
  case 4:
    uVar4 = *(uint *)&id[4].pMethods;
    goto LAB_0012442f;
  case 5:
    lVar1 = *pArg;
    if (0 < *(int *)&id[9].pMethods) {
      iVar3 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,&local_c8);
      if (iVar3 != 0) {
        return 0x70a;
      }
      lVar10 = lVar1 + *(int *)&id[9].pMethods + -1;
      lVar10 = lVar10 - lVar10 % (long)*(int *)&id[9].pMethods;
      if (local_98 < lVar10) {
        lVar9 = (long)local_90;
        offset = ~(local_98 % lVar9) + local_98;
        while (offset = offset + lVar9, offset < lVar9 + lVar10 + -1) {
          if (lVar10 <= offset) {
            offset = lVar10 + -1;
          }
          iVar3 = seekAndWrite((unixFile *)id,offset,"",1);
          if (iVar3 != 1) {
            return 0x30a;
          }
        }
      }
    }
    iVar3 = 0;
    if ((0 < (long)id[0xc].pMethods) && ((long)id[10].pMethods < lVar1)) {
      if ((*(int *)&id[9].pMethods < 1) &&
         (iVar3 = robust_ftruncate(*(int *)&id[3].pMethods,lVar1), iVar3 != 0)) {
        piVar7 = __errno_location();
        *(int *)&id[4].pMethods = *piVar7;
        iVar3 = 0x60a;
        unixLogErrorAtLine(0x60a,"ftruncate",(char *)id[7].pMethods,0x99e7);
      }
      else {
        iVar3 = unixMapfile((unixFile *)id,lVar1);
      }
    }
    break;
  case 6:
    *(undefined4 *)&id[9].pMethods = *pArg;
    goto LAB_00124510;
  case 10:
    mask = '\x04';
    goto LAB_00124504;
  case 0xc:
    iVar3 = 0;
    pcVar5 = sqlite3_mprintf("%s",(id[1].pMethods)->xWrite);
    *(char **)pArg = pcVar5;
    break;
  case 0xd:
    mask = '\x10';
LAB_00124504:
    unixModeBit((unixFile *)id,mask,(int *)pArg);
    goto LAB_00124510;
  case 0x10:
    pcVar5 = (char *)sqlite3_malloc64((long)*(int *)&(id[1].pMethods)->xClose);
    iVar3 = 0;
    if (pcVar5 != (char *)0x0) {
      unixGetTempname(*(int *)&(id[1].pMethods)->xClose,pcVar5);
      *(char **)pArg = pcVar5;
    }
    break;
  case 0x12:
    psVar6 = (sqlite3_io_methods *)sqlite3Config.mxMmap;
    if ((long)*pArg < sqlite3Config.mxMmap) {
      psVar6 = *pArg;
    }
    psVar2 = id[0xc].pMethods;
    *(sqlite3_io_methods **)pArg = psVar2;
    iVar3 = 0;
    if (((psVar6 != psVar2 && -1 < (long)psVar6) && (*(int *)((long)&id[9].pMethods + 4) == 0)) &&
       (id[0xc].pMethods = psVar6, 0 < (long)id[10].pMethods)) {
      unixUnmapfile((unixFile *)id);
      iVar3 = unixMapfile((unixFile *)id,-1);
      return iVar3;
    }
    break;
  case 0x14:
    uVar4 = fileHasMoved((unixFile *)id);
LAB_0012442f:
    *(uint *)pArg = uVar4;
    goto LAB_00124510;
  default:
    if (op != 0x28) {
      return 0xc;
    }
    *(undefined4 *)pArg = 0;
    if (id[8].pMethods != (sqlite3_io_methods *)0x0) {
      lVar1 = *(long *)id[8].pMethods;
      uStack_b0 = 0;
      local_c8 = 1;
      uStack_c0 = 0x7b;
      local_b8 = 5;
      if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 8));
      }
      iVar8 = 0;
      iVar3 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(lVar1 + 0x18),5,&local_c8);
      if (iVar3 < 0) {
        iVar8 = 0xf0a;
      }
      else {
        *(uint *)pArg = (uint)((short)local_c8 != 2);
      }
      if (*(sqlite3_mutex **)(lVar1 + 8) == (sqlite3_mutex *)0x0) {
        return iVar8;
      }
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 8));
      return iVar8;
    }
LAB_00124510:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int unixFileControl(sqlite3_file *id, int op, void *pArg){
  unixFile *pFile = (unixFile*)id;
  switch( op ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    case SQLITE_FCNTL_BEGIN_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_START_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_BEGIN_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_COMMIT_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_COMMIT_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_COMMIT_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_ROLLBACK_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_ABORT_VOLATILE_WRITE);
      return rc ? SQLITE_IOERR_ROLLBACK_ATOMIC : SQLITE_OK;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    case SQLITE_FCNTL_LOCKSTATE: {
      *(int*)pArg = pFile->eFileLock;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_LAST_ERRNO: {
      *(int*)pArg = pFile->lastErrno;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_CHUNK_SIZE: {
      pFile->szChunk = *(int *)pArg;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_SIZE_HINT: {
      int rc;
      SimulateIOErrorBenign(1);
      rc = fcntlSizeHint(pFile, *(i64 *)pArg);
      SimulateIOErrorBenign(0);
      return rc;
    }
    case SQLITE_FCNTL_PERSIST_WAL: {
      unixModeBit(pFile, UNIXFILE_PERSIST_WAL, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_POWERSAFE_OVERWRITE: {
      unixModeBit(pFile, UNIXFILE_PSOW, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_VFSNAME: {
      *(char**)pArg = sqlite3_mprintf("%s", pFile->pVfs->zName);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_TEMPFILENAME: {
      char *zTFile = sqlite3_malloc64( pFile->pVfs->mxPathname );
      if( zTFile ){
        unixGetTempname(pFile->pVfs->mxPathname, zTFile);
        *(char**)pArg = zTFile;
      }
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_HAS_MOVED: {
      *(int*)pArg = fileHasMoved(pFile);
      return SQLITE_OK;
    }
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    case SQLITE_FCNTL_LOCK_TIMEOUT: {
      int iOld = pFile->iBusyTimeout;
      pFile->iBusyTimeout = *(int*)pArg;
      *(int*)pArg = iOld;
      return SQLITE_OK;
    }
#endif
#if SQLITE_MAX_MMAP_SIZE>0
    case SQLITE_FCNTL_MMAP_SIZE: {
      i64 newLimit = *(i64*)pArg;
      int rc = SQLITE_OK;
      if( newLimit>sqlite3GlobalConfig.mxMmap ){
        newLimit = sqlite3GlobalConfig.mxMmap;
      }

      /* The value of newLimit may be eventually cast to (size_t) and passed
      ** to mmap(). Restrict its value to 2GB if (size_t) is not at least a
      ** 64-bit type. */
      if( newLimit>0 && sizeof(size_t)<8 ){
        newLimit = (newLimit & 0x7FFFFFFF);
      }

      *(i64*)pArg = pFile->mmapSizeMax;
      if( newLimit>=0 && newLimit!=pFile->mmapSizeMax && pFile->nFetchOut==0 ){
        pFile->mmapSizeMax = newLimit;
        if( pFile->mmapSize>0 ){
          unixUnmapfile(pFile);
          rc = unixMapfile(pFile, -1);
        }
      }
      return rc;
    }
#endif
#ifdef SQLITE_DEBUG
    /* The pager calls this method to signal that it has done
    ** a rollback and that the database is therefore unchanged and
    ** it hence it is OK for the transaction change counter to be
    ** unchanged.
    */
    case SQLITE_FCNTL_DB_UNCHANGED: {
      ((unixFile*)id)->dbUpdate = 0;
      return SQLITE_OK;
    }
#endif
#if SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__)
    case SQLITE_FCNTL_SET_LOCKPROXYFILE:
    case SQLITE_FCNTL_GET_LOCKPROXYFILE: {
      return proxyFileControl(id,op,pArg);
    }
#endif /* SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__) */

    case SQLITE_FCNTL_EXTERNAL_READER: {
#ifndef SQLITE_OMIT_WAL
      return unixFcntlExternalReader((unixFile*)id, (int*)pArg);
#else
      *(int*)pArg = 0;
      return SQLITE_OK;
#endif
    }
  }
  return SQLITE_NOTFOUND;
}